

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

float Abc_NtkComputeDelay(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p;
  float fVar3;
  int local_74;
  int local_70;
  int k;
  int i;
  int nFaninMax;
  float Delays [15];
  float DelayMax;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  memset(&i,0,0x3c);
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  if ((1 < iVar1) && (iVar1 < 0xf)) {
    for (local_70 = 0; local_70 <= iVar1; local_70 = local_70 + 1) {
      (&i)[local_70] =
           (int)(float)(Abc_NtkComputeDelay::GateDelays[local_70] /
                       Abc_NtkComputeDelay::GateDelays[iVar1]);
    }
    for (local_70 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_70 < iVar1; local_70 = local_70 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_70);
      (pAVar2->field_6).iTemp = 0;
    }
    p = Abc_NtkDfs(pNtk,1);
    for (local_70 = 0; iVar1 = Vec_PtrSize(p), local_70 < iVar1; local_70 = local_70 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,local_70);
      (pAVar2->field_6).iTemp = 0;
      for (local_74 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_74 < iVar1; local_74 = local_74 + 1)
      {
        register0x00000000 = Abc_ObjFanin(pAVar2,local_74);
        fVar3 = Abc_MaxFloat((pAVar2->field_6).dTemp,(register0x00000000->field_6).dTemp);
        (pAVar2->field_6).dTemp = fVar3;
      }
      iVar1 = Abc_ObjFaninNum(pAVar2);
      (pAVar2->field_6).dTemp = (float)(&i)[iVar1] + (pAVar2->field_6).dTemp;
    }
    Vec_PtrFree(p);
    Delays[0xd] = 0.0;
    for (local_70 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_70 < iVar1; local_70 = local_70 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_70);
      fVar3 = Delays[0xd];
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Delays[0xd] = Abc_MaxFloat(fVar3,(pAVar2->field_6).dTemp);
    }
    return Delays[0xd];
  }
  __assert_fail("nFaninMax > 1 && nFaninMax < 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0x9c0,"float Abc_NtkComputeDelay(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkComputeDelay( Abc_Ntk_t * pNtk )
{
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    float DelayMax, Delays[15] = {0};
    int nFaninMax, i, k;
    // calculate relative gate delays
    nFaninMax = Abc_NtkGetFaninMax( pNtk );
    assert( nFaninMax > 1 && nFaninMax < 15 );
    for ( i = 0; i <= nFaninMax; i++ )
        Delays[i] = GateDelays[i]/GateDelays[nFaninMax];
    // set max CI delay
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->dTemp = 0.0;
    // compute delays for each node
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->dTemp = 0.0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pObj->dTemp = Abc_MaxFloat( pObj->dTemp, pFanin->dTemp );
        pObj->dTemp += Delays[Abc_ObjFaninNum(pObj)];
    }
    Vec_PtrFree( vNodes );
    DelayMax = 0.0;
    // find max CO delay
    Abc_NtkForEachCo( pNtk, pObj, i )
        DelayMax = Abc_MaxFloat( DelayMax, Abc_ObjFanin0(pObj)->dTemp );
    return DelayMax;
}